

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O1

void __thiscall CLParam<int>::PrintSimple(CLParam<int> *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)(this + 8));
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(this + 0x50));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrintSimple()
    {
        std::cout << parameter_name << " " << value << std::endl ;
    }